

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlHashUpdateEntry(void)

{
  int iVar1;
  int iVar2;
  xmlHashTablePtr val;
  xmlChar *val_00;
  void *val_01;
  xmlHashDeallocator val_02;
  int local_54;
  int n_dealloc;
  xmlHashDeallocator dealloc;
  int n_payload;
  void *payload;
  int n_key;
  xmlChar *key;
  int n_hash;
  xmlHashTablePtr hash;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (key._4_4_ = 0; (int)key._4_4_ < 2; key._4_4_ = key._4_4_ + 1) {
    for (payload._4_4_ = 0; (int)payload._4_4_ < 5; payload._4_4_ = payload._4_4_ + 1) {
      for (dealloc._4_4_ = 0; (int)dealloc._4_4_ < 2; dealloc._4_4_ = dealloc._4_4_ + 1) {
        for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlHashTablePtr(key._4_4_,0);
          val_00 = gen_const_xmlChar_ptr(payload._4_4_,1);
          val_01 = gen_void_ptr(dealloc._4_4_,2);
          val_02 = gen_xmlHashDeallocator(local_54,3);
          iVar2 = xmlHashUpdateEntry(val,val_00,val_01,val_02);
          desret_int(iVar2);
          call_tests = call_tests + 1;
          des_xmlHashTablePtr(key._4_4_,val,0);
          des_const_xmlChar_ptr(payload._4_4_,val_00,1);
          des_void_ptr(dealloc._4_4_,val_01,2);
          des_xmlHashDeallocator(local_54,val_02,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashUpdateEntry",(ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)key._4_4_);
            printf(" %d",(ulong)payload._4_4_);
            printf(" %d",(ulong)dealloc._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlHashUpdateEntry(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlHashTablePtr hash; /* hash table */
    int n_hash;
    const xmlChar * key; /* string key */
    int n_key;
    void * payload; /* pointer to the payload */
    int n_payload;
    xmlHashDeallocator dealloc; /* deallocator function for replaced item or NULL */
    int n_dealloc;

    for (n_hash = 0;n_hash < gen_nb_xmlHashTablePtr;n_hash++) {
    for (n_key = 0;n_key < gen_nb_const_xmlChar_ptr;n_key++) {
    for (n_payload = 0;n_payload < gen_nb_void_ptr;n_payload++) {
    for (n_dealloc = 0;n_dealloc < gen_nb_xmlHashDeallocator;n_dealloc++) {
        mem_base = xmlMemBlocks();
        hash = gen_xmlHashTablePtr(n_hash, 0);
        key = gen_const_xmlChar_ptr(n_key, 1);
        payload = gen_void_ptr(n_payload, 2);
        dealloc = gen_xmlHashDeallocator(n_dealloc, 3);

        ret_val = xmlHashUpdateEntry(hash, key, payload, dealloc);
        desret_int(ret_val);
        call_tests++;
        des_xmlHashTablePtr(n_hash, hash, 0);
        des_const_xmlChar_ptr(n_key, key, 1);
        des_void_ptr(n_payload, payload, 2);
        des_xmlHashDeallocator(n_dealloc, dealloc, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlHashUpdateEntry",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_hash);
            printf(" %d", n_key);
            printf(" %d", n_payload);
            printf(" %d", n_dealloc);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}